

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O1

Reals __thiscall
Omega_h::compute_flip_normals_dim<2>
          (Omega_h *this,Mesh *mesh,Bytes *sides_are_exposed,Bytes *verts_matter,
          Real simple_algorithm_threshold)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  LO LVar4;
  void *extraout_RDX;
  ulong uVar5;
  Reals RVar6;
  Write<double> out;
  Bytes sides_are_exposed_copy;
  Reals coords;
  LOs verts_that_matter;
  LOs sv2v;
  type f;
  Adj v2s;
  Write<double> local_168;
  Alloc *local_158;
  pointer local_150;
  Write<double> local_148;
  Alloc *local_138;
  element_type *local_130;
  Read<signed_char> local_128;
  Alloc *local_118;
  pointer local_110;
  Alloc *local_108;
  element_type *local_100;
  type local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  Read<signed_char> local_68;
  Adj local_58;
  
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)simple_algorithm_threshold;
  Mesh::ask_up(&local_58,mesh,0,1);
  Mesh::ask_verts_of((Mesh *)&local_108,(Int)mesh);
  local_128.write_.shared_alloc_.alloc = (verts_matter->write_).shared_alloc_.alloc;
  if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
      local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128.write_.shared_alloc_.alloc =
           (Alloc *)((local_128.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_128.write_.shared_alloc_.alloc)->use_count =
           (local_128.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_128.write_.shared_alloc_.direct_ptr = (verts_matter->write_).shared_alloc_.direct_ptr;
  collect_marked((Omega_h *)&local_118,&local_128);
  pAVar3 = local_128.write_.shared_alloc_.alloc;
  if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
      local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_128.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_128.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  Mesh::coords((Mesh *)&local_138);
  LVar4 = Mesh::nverts(mesh);
  local_f8.verts_that_matter.write_.shared_alloc_.alloc = (Alloc *)&local_f8.v2s;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Write<double>::Write(&local_168,LVar4 * 2,0.0,(string *)&local_f8);
  if (local_f8.verts_that_matter.write_.shared_alloc_.alloc != (Alloc *)&local_f8.v2s) {
    operator_delete(local_f8.verts_that_matter.write_.shared_alloc_.alloc,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)&(local_f8.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc)->
                                        size)->_M_ptr + 1));
  }
  local_158 = (sides_are_exposed->write_).shared_alloc_.alloc;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)(local_158->size * 8 + 1);
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  local_150 = (pointer)(sides_are_exposed->write_).shared_alloc_.direct_ptr;
  local_f8.verts_that_matter.write_.shared_alloc_.alloc = local_118;
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.verts_that_matter.write_.shared_alloc_.alloc = (Alloc *)(local_118->size * 8 + 1);
    }
    else {
      local_118->use_count = local_118->use_count + 1;
    }
  }
  local_f8.verts_that_matter.write_.shared_alloc_.direct_ptr = local_110;
  local_f8.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_58.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.v2s.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_f8.v2s.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.v2s.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.v2s.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_f8.v2s.codes.write_.shared_alloc_.alloc = local_58.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_58.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.v2s.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.codes.write_.shared_alloc_.alloc)->use_count =
           (local_58.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.v2s.codes.write_.shared_alloc_.direct_ptr =
       local_58.codes.write_.shared_alloc_.direct_ptr;
  local_f8.sides_are_exposed_copy.write_.shared_alloc_.alloc = local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.sides_are_exposed_copy.write_.shared_alloc_.alloc =
           (Alloc *)(local_158->size * 8 + 1);
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  local_f8.sv2v.write_.shared_alloc_.alloc = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.sv2v.write_.shared_alloc_.alloc = (Alloc *)(local_108->size * 8 + 1);
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  local_f8.sv2v.write_.shared_alloc_.direct_ptr = local_100;
  local_f8.coords.write_.shared_alloc_.alloc = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.coords.write_.shared_alloc_.alloc = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  local_f8.coords.write_.shared_alloc_.direct_ptr = local_130;
  local_f8.threshold_copy = (Real)local_70._M_pi;
  local_f8.out.shared_alloc_.alloc = local_168.shared_alloc_.alloc;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.out.shared_alloc_.alloc = (Alloc *)((local_168.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.shared_alloc_.alloc)->use_count = (local_168.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.out.shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
  if (((ulong)local_118 & 1) == 0) {
    uVar5 = local_118->size;
  }
  else {
    uVar5 = (ulong)local_118 >> 3;
  }
  local_f8.sides_are_exposed_copy.write_.shared_alloc_.direct_ptr = local_150;
  parallel_for<Omega_h::compute_flip_normals_dim<2>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)::_lambda(int)_1_>
            ((LO)(uVar5 >> 2),&local_f8,"compute_flip_normals");
  local_148.shared_alloc_.alloc = local_168.shared_alloc_.alloc;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148.shared_alloc_.alloc = (Alloc *)((local_168.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.shared_alloc_.alloc)->use_count = (local_168.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_148.shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_68,&local_148);
  Mesh::sync_array<double>((Mesh *)this,(Int)mesh,(Read<double> *)0x0,(Int)&local_68);
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
      operator_delete(local_68.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_148.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  compute_flip_normals_dim<2>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_f8);
  pAVar3 = local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    piVar1 = &local_158->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.shared_alloc_.alloc);
      operator_delete(local_168.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    piVar1 = &local_138->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_138);
      operator_delete(local_138,0x48);
    }
  }
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    piVar1 = &local_118->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118);
      operator_delete(local_118,0x48);
    }
  }
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    piVar1 = &local_108->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108);
      operator_delete(local_108,0x48);
    }
  }
  Adj::~Adj(&local_58);
  RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals compute_flip_normals_dim(Mesh* mesh, Bytes sides_are_exposed,
    Bytes verts_matter,
    Real simple_algorithm_threshold = 0.95)  // constant given by Aubry and Lohner
{
  constexpr auto side_dim = dim - 1;
  auto v2s = mesh->ask_up(VERT, side_dim);
  auto sv2v = mesh->ask_verts_of(side_dim);
  auto verts_that_matter = collect_marked(verts_matter);
  auto coords = mesh->coords();
  auto out = Write<Real>(mesh->nverts() * dim, 0.0);
  auto const threshold_copy = simple_algorithm_threshold;
  auto sides_are_exposed_copy = sides_are_exposed;
  auto f = OMEGA_H_LAMBDA(LO vm) {
    auto v = verts_that_matter[vm];
    auto N_c = zero_vector<dim>();
    constexpr auto max_adj_sides =
        SimplexAvgDegree<side_dim, VERT, side_dim>::value * 4;
    Few<Vector<dim>, max_adj_sides> N;
    auto n = 0;
    for (auto vs = v2s.a2ab[v]; vs < v2s.a2ab[v + 1]; ++vs) {
      auto s = v2s.ab2b[vs];
      if (!sides_are_exposed_copy[s]) continue;
      OMEGA_H_CHECK(n < max_adj_sides);
      constexpr auto side_dim2 = dim - 1;
      auto ssv2v = gather_verts<side_dim2 + 1>(sv2v, s);
      auto ssv2x = gather_vectors<side_dim2 + 1, dim>(coords, ssv2v);
      auto svec = get_side_vector(ssv2x);
      N_c += svec;  // svec is the area weighted face normal
      N[n++] = normalize(svec);
    }
    // as suggested by Aubry and Lohner, start with an initial guess done by
    // some kind of averaging (area weighted being an option)
    N_c = normalize(N_c);
    // if that is roughly the same as all the face normals, just accept it
    // and don't bother with the expensive algorithm.
    // this is especially a good idea because most models are mostly flat
    // surfaces
    Int i;
    for (i = 0; i < n; ++i) {
      if (N_c * N[i] < threshold_copy) break;
    }
    if (i < n) {
      // nope, we actually have some nontrivial normals here.
      // run the super expensive algorithm.
      N_c = get_most_normal_normal(N, n);
    }
    set_vector(out, v, N_c);
  };
  parallel_for(verts_that_matter.size(), f, "compute_flip_normals");
  return mesh->sync_array(VERT, Reals(out), dim);
}